

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_tests.hpp
# Opt level: O3

string * __thiscall
iuutil::TestSuiteNameRemoveInstantiateAndIndexName_abi_cxx11_
          (string *__return_storage_ptr__,iuutil *this,char *name)

{
  size_type *psVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 *puVar5;
  ulong uVar6;
  allocator<char> local_69;
  ulong *local_68;
  long local_60;
  ulong local_58 [2];
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  pcVar3 = strrchr((char *)this,0x2e);
  pcVar4 = strchr((char *)this,0x2f);
  if (pcVar4 == (char *)0x0) {
LAB_0011b471:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,(allocator<char> *)&local_48);
    return __return_storage_ptr__;
  }
  if (pcVar3 == (char *)0x0) {
    this = (iuutil *)(pcVar4 + 1);
    pcVar3 = strrchr((char *)this,0x2f);
    if (pcVar3 != (char *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,this,pcVar3);
      return __return_storage_ptr__;
    }
    goto LAB_0011b471;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,this,pcVar3 + 1);
  pcVar4 = pcVar4 + 1;
  pcVar3 = strrchr(pcVar4,0x2f);
  if (pcVar3 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar4,&local_69);
  }
  else {
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar4,pcVar3);
  }
  uVar6 = 0xf;
  if (local_48 != local_38) {
    uVar6 = local_38[0];
  }
  if (uVar6 < (ulong)(local_60 + local_40)) {
    uVar6 = 0xf;
    if (local_68 != local_58) {
      uVar6 = local_58[0];
    }
    if ((ulong)(local_60 + local_40) <= uVar6) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
      goto LAB_0011b51f;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
LAB_0011b51f:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar2 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if (local_48 == local_38) {
    return __return_storage_ptr__;
  }
  operator_delete(local_48,local_38[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string TestSuiteNameRemoveInstantiateAndIndexName(const char* name)
{
    // パッケージ名があれば取得
    const char* const pkg = strrchr(name, '.');
    // 先頭にインスタンス名がある
    const char* const p1 = strchr(name, '/');
    if( p1 == NULL )
    {
        return name;
    }
    if( pkg == NULL )
    {
        return TestSuiteNameRemoveIndexName(p1 + 1);
    }
    else
    {
        return ::std::string(name, pkg + 1) + TestSuiteNameRemoveIndexName(p1 + 1);
    }
}